

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

vector<CAddress,_std::allocator<CAddress>_> *
ConvertSeeds(vector<unsigned_char,_std::allocator<unsigned_char>_> *vSeedsIn)

{
  long lVar1;
  Span<const_unsigned_char> sp;
  string_view source_file;
  string_view logging_function;
  bool bVar2;
  duration range;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> this;
  vector<CAddress,_std::allocator<CAddress>_> *in_RDI;
  long in_FS_OFFSET;
  vector<CAddress,_std::allocator<CAddress>_> *vSeedsOut;
  ParamsStream<DataStream,_CAddress::SerParams> s;
  duration<long,_std::ratio<3600L,_1L>_> one_week;
  CAddress addr;
  CService endpoint;
  FastRandomContext rng;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  char *in_stack_fffffffffffffd90;
  FastRandomContext *in_stack_fffffffffffffd98;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  duration<long,_std::ratio<3600L,_1L>_> in_stack_fffffffffffffdb0;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> in_stack_fffffffffffffdb8
  ;
  int in_stack_fffffffffffffdfc;
  ConstevalFormatString<1U> in_stack_fffffffffffffe38;
  duration<long,_std::ratio<3600L,_1L>_> dVar3;
  char *in_stack_fffffffffffffe48;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar4;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar5;
  Level in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)
             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  FastRandomContext::FastRandomContext
            (in_stack_fffffffffffffd98,SUB81((ulong)in_stack_fffffffffffffd90 >> 0x38,0));
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffd98,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd90,
             (type)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  sp.m_size = (size_t)in_stack_fffffffffffffdb8.__d.__r;
  sp.m_data = (uchar *)in_stack_fffffffffffffdb0.__r;
  DataStream::DataStream((DataStream *)in_stack_fffffffffffffd98,sp);
  ParamsStream<DataStream,_CAddress::SerParams>::ParamsStream
            ((ParamsStream<DataStream,_CAddress::SerParams> *)in_stack_fffffffffffffd98,
             (DataStream *)in_stack_fffffffffffffd90,
             (SerParams *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  DataStream::~DataStream
            ((DataStream *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  while (bVar2 = ParamsStream<DataStream,_CAddress::SerParams>::eof
                           ((ParamsStream<DataStream,_CAddress::SerParams> *)
                            CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88)),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    CService::CService((CService *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    ParamsStream<DataStream,CAddress::SerParams>::operator>>
              ((ParamsStream<DataStream,_CAddress::SerParams> *)in_stack_fffffffffffffd98,
               (CService *)in_stack_fffffffffffffd90);
    CService::CService((CService *)in_stack_fffffffffffffd98,(CService *)in_stack_fffffffffffffd90);
    range.__r = SeedsServiceFlags();
    CAddress::CAddress((CAddress *)in_stack_fffffffffffffdb8.__d.__r,
                       (CService *)in_stack_fffffffffffffdb0.__r,
                       CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
    CService::~CService((CService *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    this = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    tVar4 = this;
    in_stack_fffffffffffffdb8 =
         std::chrono::operator-
                   ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                    in_stack_fffffffffffffd90,
                    (duration<long,_std::ratio<3600L,_1L>_> *)
                    CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    tVar5 = in_stack_fffffffffffffdb8;
    in_stack_fffffffffffffdb0 =
         std::chrono::duration<long,_std::ratio<3600L,_1L>_>::operator-
                   ((duration<long,_std::ratio<3600L,_1L>_> *)
                    CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    dVar3 = in_stack_fffffffffffffdb0;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffd90,
               (duration<long,_std::ratio<3600L,_1L>_> *)
               CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    RandomMixin<FastRandomContext>::
    rand_uniform_delay<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
              ((RandomMixin<FastRandomContext> *)
               CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
               in_stack_fffffffffffffda0,range);
    in_stack_fffffffffffffdaf =
         LogAcceptCategory(CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),Trace);
    if ((bool)in_stack_fffffffffffffdaf) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                 (char *)in_stack_fffffffffffffda0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                 (char *)in_stack_fffffffffffffda0);
      in_stack_fffffffffffffd90 = "Added hardcoded seed: %s\n";
      CService::ToStringAddrPort_abi_cxx11_((CService *)this.__d.__r);
      in_stack_fffffffffffffd98 = (FastRandomContext *)&stack0xfffffffffffffec8;
      in_stack_fffffffffffffd88 = 1;
      logging_function._M_str = (char *)tVar5.__d.__r;
      logging_function._M_len = (size_t)tVar4.__d.__r;
      source_file._M_str = in_stack_fffffffffffffe48;
      source_file._M_len = dVar3.__r;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,in_stack_fffffffffffffdfc,
                 (LogFlags)in_stack_fffffffffffffd90,in_stack_ffffffffffffff30,
                 in_stack_fffffffffffffe38,in_stack_ffffffffffffff40);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    }
    std::vector<CAddress,_std::allocator<CAddress>_>::push_back
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffffd98,
               (value_type *)in_stack_fffffffffffffd90);
    CAddress::~CAddress((CAddress *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    CService::~CService((CService *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  }
  ParamsStream<DataStream,_CAddress::SerParams>::~ParamsStream
            ((ParamsStream<DataStream,_CAddress::SerParams> *)
             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  FastRandomContext::~FastRandomContext
            ((FastRandomContext *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<CAddress> ConvertSeeds(const std::vector<uint8_t> &vSeedsIn)
{
    // It'll only connect to one or two seed nodes because once it connects,
    // it'll get a pile of addresses with newer timestamps.
    // Seed nodes are given a random 'last seen time' of between one and two
    // weeks ago.
    const auto one_week{7 * 24h};
    std::vector<CAddress> vSeedsOut;
    FastRandomContext rng;
    ParamsStream s{DataStream{vSeedsIn}, CAddress::V2_NETWORK};
    while (!s.eof()) {
        CService endpoint;
        s >> endpoint;
        CAddress addr{endpoint, SeedsServiceFlags()};
        addr.nTime = rng.rand_uniform_delay(Now<NodeSeconds>() - one_week, -one_week);
        LogDebug(BCLog::NET, "Added hardcoded seed: %s\n", addr.ToStringAddrPort());
        vSeedsOut.push_back(addr);
    }
    return vSeedsOut;
}